

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

InplaceStr GetModuleName(Allocator *allocator,char *moduleRoot,IntrusiveList<SynIdentifier> parts)

{
  SynIdentifier *pSVar1;
  char *__src;
  size_t sVar2;
  undefined4 extraout_var;
  SynIdentifier *pSVar3;
  char *__dest;
  SynIdentifier *pSVar4;
  int iVar5;
  InplaceStr IVar6;
  
  iVar5 = 0;
  pSVar4 = parts.head;
  for (pSVar1 = pSVar4; pSVar1 != (SynIdentifier *)0x0;
      pSVar1 = (SynIdentifier *)(pSVar1->super_SynBase).next) {
    iVar5 = iVar5 + 1;
  }
  pSVar1 = pSVar4;
  if (moduleRoot == (char *)0x0) {
    iVar5 = iVar5 + 2;
  }
  else {
    sVar2 = strlen(moduleRoot);
    iVar5 = iVar5 + (int)sVar2 + 3;
  }
  while (pSVar1 != (SynIdentifier *)0x0) {
    pSVar3 = (SynIdentifier *)(pSVar1->super_SynBase).next;
    if ((pSVar3 == (SynIdentifier *)0x0) || ((pSVar3->super_SynBase).typeID != 4)) {
      pSVar3 = (SynIdentifier *)0x0;
    }
    iVar5 = iVar5 + (*(int *)&(pSVar1->name).end - *(int *)&(pSVar1->name).begin);
    pSVar1 = pSVar3;
  }
  iVar5 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)(iVar5 + 1));
  IVar6.begin = (char *)CONCAT44(extraout_var,iVar5);
  __dest = IVar6.begin;
  if (moduleRoot != (char *)0x0) {
    strcpy(IVar6.begin,moduleRoot);
    sVar2 = strlen(moduleRoot);
    __dest = IVar6.begin + sVar2 + 1;
    IVar6.begin[sVar2] = '/';
  }
  while (pSVar4 != (SynIdentifier *)0x0) {
    __src = (pSVar4->name).begin;
    memcpy(__dest,__src,(ulong)(uint)(*(int *)&(pSVar4->name).end - (int)__src));
    __dest = __dest + (uint)(*(int *)&(pSVar4->name).end - *(int *)&(pSVar4->name).begin);
    if ((pSVar4->super_SynBase).next != (SynBase *)0x0) {
      *__dest = '/';
      __dest = __dest + 1;
    }
    pSVar4 = (SynIdentifier *)(pSVar4->super_SynBase).next;
    if ((pSVar4 == (SynIdentifier *)0x0) || ((pSVar4->super_SynBase).typeID != 4)) {
      pSVar4 = (SynIdentifier *)0x0;
    }
  }
  builtin_strncpy(__dest,".nc",4);
  sVar2 = strlen(IVar6.begin);
  IVar6.end = IVar6.begin + sVar2;
  return IVar6;
}

Assistant:

InplaceStr GetModuleName(Allocator *allocator, const char *moduleRoot, IntrusiveList<SynIdentifier> parts)
{
	unsigned pathLength = unsigned(parts.size() - 1 + strlen(".nc"));

	if(moduleRoot)
		pathLength += unsigned(strlen(moduleRoot)) + 1;

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
		pathLength += part->name.length();

	char *path = (char*)allocator->alloc(pathLength + 1);

	char *pos = path;

	if(moduleRoot)
	{
		strcpy(pos, moduleRoot);
		pos += strlen(moduleRoot);

		*pos++ = '/';
	}

	for(SynIdentifier *part = parts.head; part; part = getType<SynIdentifier>(part->next))
	{
		memcpy(pos, part->name.begin, part->name.length());
		pos += part->name.length();

		if(part->next)
			*pos++ = '/';
	}

	strcpy(pos, ".nc");
	pos += strlen(".nc");

	*pos = 0;

	return InplaceStr(path);
}